

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<Fad<float>_>::VerifySymmetry(TPZMatrix<Fad<float>_> *this,REAL tol)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long local_c0;
  Fad<float> local_a0;
  FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> local_80;
  Fad<float> exp;
  Fad<float> local_50;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  uVar2 = 0;
  if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
    lVar5 = 0;
    lVar3 = 0;
    if (0 < lVar1) {
      lVar3 = lVar1;
    }
    local_c0 = 1;
    for (; lVar5 != lVar3; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; local_c0 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&local_a0,this,lVar5,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&local_50,this,lVar6,lVar5);
        local_80.fadexpr_.left_ = &local_a0;
        local_80.fadexpr_.right_ = &local_50;
        Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>(&exp,&local_80);
        Fad<float>::~Fad(&local_50);
        Fad<float>::~Fad(&local_a0);
        if (tol < (double)ABS(exp.val_)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Elemento: ");
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          poVar4 = std::operator<<(poVar4,"  -> ");
          poVar4 = ::operator<<(poVar4,&exp);
          poVar4 = std::operator<<(poVar4,"/");
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_a0,this,lVar5,lVar6);
          poVar4 = ::operator<<(poVar4,&local_a0);
          std::endl<char,std::char_traits<char>>(poVar4);
          Fad<float>::~Fad(&local_a0);
          Fad<float>::~Fad(&exp);
          goto LAB_00d24bcc;
        }
        Fad<float>::~Fad(&exp);
      }
      local_c0 = local_c0 + 1;
    }
LAB_00d24bcc:
    uVar2 = (uint)(lVar1 <= lVar5);
  }
  return uVar2;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}